

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall Statements::print(Statements *this)

{
  Statement *pSVar1;
  bool bVar2;
  reference ppSVar3;
  int local_34;
  int i;
  Statement *s;
  iterator __end1;
  iterator __begin1;
  vector<Statement_*,_std::allocator<Statement_*>_> *__range1;
  Statements *this_local;
  
  __end1 = std::vector<Statement_*,_std::allocator<Statement_*>_>::begin(&this->_statements);
  s = (Statement *)std::vector<Statement_*,_std::allocator<Statement_*>_>::end(&this->_statements);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>
                                     *)&s), bVar2) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>
              ::operator*(&__end1);
    pSVar1 = *ppSVar3;
    std::operator<<((ostream *)&std::cout,"\n");
    if (pSVar1 != (Statement *)0x0) {
      for (local_34 = 0; local_34 < this->_indState; local_34 = local_34 + 1) {
        std::operator<<((ostream *)&std::cout," ");
      }
      pSVar1->indentState = this->_indState;
      (**pSVar1->_vptr_Statement)();
    }
    __gnu_cxx::
    __normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Statements::print() {
    //std::cout << "Printing Statements...\n";

    for (auto s: _statements) {
        std::cout << "\n";
        if(s == NULL) continue;
        for (int i = 0; i < _indState; i++)
            std::cout << " "; // exact spaces for indent
        s->indentState = _indState;
        s->print();
    }

}